

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O3

void __thiscall
transaction_tests::test_big_witness_transaction::test_method(test_big_witness_transaction *this)

{
  pointer pCVar1;
  bool bVar2;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  ulong uVar3;
  allocator_type *__a;
  int iVar4;
  iterator in_R8;
  iterator in_R9;
  long lVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  const_string file;
  span<const_std::byte,_18446744073709551615UL> b;
  const_string msg;
  string_view str;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  vector<Coin,_std::allocator<Coin>_> coins;
  DataStream ssout;
  vector<int,_std::allocator<int>_> sigHashes;
  CMutableTransaction mtx;
  CCheckQueueControl<CScriptCheck> control;
  CCheckQueue<FakeCheckCheckCompletion> scriptcheckqueue;
  PrecomputedTransactionData txdata;
  CTransaction tx;
  SignatureCache signature_cache;
  CKeyID hash;
  FillableSigningProvider keystore;
  check_type cVar7;
  PrecomputedTransactionData *local_858;
  bool local_84d;
  uint local_84c;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  uint local_82c;
  vector<Coin,_std::allocator<Coin>_> local_828;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_808;
  undefined8 uStack_7f0;
  vector<int,_std::allocator<int>_> local_7e8;
  char *local_7d0;
  char *local_7c8;
  undefined1 *local_7c0;
  undefined1 *local_7b8;
  char *local_7b0;
  char *local_7a8;
  undefined1 local_7a0 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_798;
  CMutableTransaction local_790;
  CCheckQueueControl<CScriptCheck> local_758;
  undefined1 local_748 [216];
  pthread_mutex_t local_670;
  undefined1 local_648 [16];
  undefined1 *local_638;
  CTransaction *pCStack_630;
  vector<CTxOut,_std::allocator<CTxOut>_> local_540;
  CTransaction local_518;
  undefined1 local_498 [8];
  prevector<28U,_unsigned_char,_unsigned_int,_int> pStack_490;
  direct_or_indirect local_470 [5];
  _Rb_tree_node_base local_3d0;
  size_t local_3b0;
  _Storage<TaprootBuilder,_false> local_3a8;
  undefined1 local_340;
  _Rb_tree_node_base local_330;
  size_t local_310;
  _Rb_tree_node_base local_300;
  size_t local_2e0;
  pointer puStack_2d8;
  pointer local_2d0;
  pointer puStack_2c8;
  _Rb_tree_node_base local_2b8;
  size_t local_298;
  _Rb_tree_node_base local_288;
  size_t local_268;
  _Rb_tree_node_base local_258;
  size_t local_238;
  pointer pCStack_230;
  pointer local_228;
  pointer pCStack_220;
  pointer local_218;
  pointer pCStack_210;
  pointer local_208;
  uchar auStack_200 [64];
  _Rb_tree_node_base local_1c0;
  size_t local_1a0;
  _Rb_tree_node_base local_190;
  size_t local_170;
  _Rb_tree_node_base local_160;
  size_t local_140;
  _Rb_tree_node_base local_130;
  size_t local_110;
  direct_or_indirect local_100;
  uint local_e4;
  CKeyID local_dc;
  FillableSigningProvider local_c8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&local_790);
  local_790.version = 1;
  GenerateRandomKey(SUB81(local_7a0,0));
  local_c8.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_01399e20;
  local_c8.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8.mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  local_c8.mapScripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  local_c8.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  local_c8.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  local_c8.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  local_7b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_7a8 = "";
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x213;
  file.m_begin = (iterator)&local_7b0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  local_c8.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c8.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_7c0,msg);
  CKey::GetPubKey((CPubKey *)local_498,(CKey *)local_7a0);
  local_748[0] = FillableSigningProvider::AddKeyPubKey
                           (&local_c8,(CKey *)local_7a0,(CPubKey *)local_498);
  local_748._8_8_ = (element_type *)0x0;
  local_748._16_8_ = (sp_counted_base *)0x0;
  pCStack_630 = &local_518;
  local_518.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xf20376;
  local_518.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf203a1;
  local_648._8_8_ = local_648._8_8_ & 0xffffffffffffff00;
  local_648._0_8_ = &PTR__lazy_ostream_01389048;
  local_638 = boost::unit_test::lazy_ostream::inst;
  local_7d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_7c8 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_748,(lazy_ostream *)local_648,1,0,WARN,_cVar7,
             (size_t)&local_7d0,0x213);
  boost::detail::shared_count::~shared_count((shared_count *)(local_748 + 0x10));
  CKey::GetPubKey((CPubKey *)local_498,(CKey *)local_7a0);
  CPubKey::GetID(&local_dc,(CPubKey *)local_498);
  pStack_490._union._8_8_ = (undefined1 *)0x0;
  pStack_490._union._16_8_ = (CTransaction *)0x0;
  local_498 = (undefined1  [8])0x0;
  pStack_490._union._0_8_ = (_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)0x0;
  local_648._0_8_ = local_648._0_8_ & 0xffffffffffffff00;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_498,(iterator)local_498,
             local_648);
  __a = (allocator_type *)local_748;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_648,(uchar *)&local_dc,
             (uchar *)&local_c8,__a);
  b._M_extent._M_extent_value = local_648._8_8_ - local_648._0_8_;
  b._M_ptr = (pointer)local_648._0_8_;
  other = &CScript::operator<<((CScript *)local_498,b)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_100.indirect_contents,other)
  ;
  if ((TransactionSerParams *)local_648._0_8_ != (TransactionSerParams *)0x0) {
    operator_delete((void *)local_648._0_8_,(long)local_638 - local_648._0_8_);
  }
  if (0x1c < (uint)pStack_490._union._20_4_) {
    free((void *)local_498);
  }
  local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_498[0] = 0x82;
  local_498[1] = '\0';
  local_498[2] = '\0';
  local_498[3] = '\0';
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
            (&local_7e8,(iterator)0x0,(int *)local_498);
  local_498[0] = 0x83;
  local_498[1] = '\0';
  local_498[2] = '\0';
  local_498[3] = '\0';
  if (local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_7e8,
               (iterator)
               local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)local_498);
  }
  else {
    *local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0x83;
    local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_498[0] = 0x81;
  local_498[1] = '\0';
  local_498[2] = '\0';
  local_498[3] = '\0';
  if (local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_7e8,
               (iterator)
               local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)local_498);
  }
  else {
    *local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0x81;
    local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_498[0] = '\x02';
  local_498[1] = '\0';
  local_498[2] = '\0';
  local_498[3] = '\0';
  if (local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_7e8,
               (iterator)
               local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)local_498);
  }
  else {
    *local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_498[0] = '\x03';
  local_498[1] = '\0';
  local_498[2] = '\0';
  local_498[3] = '\0';
  if (local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_7e8,
               (iterator)
               local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)local_498);
  }
  else {
    *local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 3;
    local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_498._0_4_ = 1;
  if (local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_7e8,
               (iterator)
               local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)local_498);
  }
  else {
    *local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  iVar4 = 0x1194;
  do {
    lVar5 = (long)local_790.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_790.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start;
    str._M_str = (char *)__a;
    str._M_len = (size_t)"0000000000000000000000000000000000000000000000000000000000000100";
    detail::FromHex<uint256>((optional<uint256> *)local_498,(detail *)0x40,str);
    if (pStack_490._union.direct[0x18] == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_0066c9e6;
    }
    local_638 = (undefined1 *)pStack_490._union._8_8_;
    pCStack_630 = (CTransaction *)pStack_490._union._16_8_;
    local_648._0_8_ = local_498;
    local_648._8_8_ = pStack_490._union._0_8_;
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              (&local_790.vin,
               ((long)local_790.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_790.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5 + 1);
    uVar6 = (lVar5 >> 3) * 0x4ec4ec4ec4ec4ec5;
    uVar3 = uVar6 & 0xffffffff;
    __a = (allocator_type *)(uVar3 * 0x68);
    *(undefined1 **)
     (__a + (long)((local_790.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>
                  .m_data._M_elems + 0x10) = local_638;
    *(CTransaction **)
     (__a + (long)((local_790.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>
                  .m_data._M_elems + 0x10 + 8) = pCStack_630;
    *(undefined8 *)
     local_790.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
     ._M_start[uVar3].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_648._0_8_
    ;
    *(undefined8 *)
     (local_790.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3].prevout.hash.m_wrapped.super_base_blob<256U>.m_data.
      _M_elems + 8) = local_648._8_8_;
    local_790.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar3].prevout.n = (uint32_t)uVar6;
    pCVar1 = local_790.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start + uVar3;
    if (0x1c < (pCVar1->scriptSig).super_CScriptBase._size) {
      free((pCVar1->scriptSig).super_CScriptBase._union.indirect_contents.indirect);
    }
    *(undefined8 *)((long)&(pCVar1->scriptSig).super_CScriptBase._union + 0x10) = 0;
    *(undefined8 *)((long)&(pCVar1->scriptSig).super_CScriptBase._union + 0x18) = 0;
    (pCVar1->scriptSig).super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
    *(undefined8 *)((long)&(pCVar1->scriptSig).super_CScriptBase._union + 8) = 0;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
              (&local_790.vout,
               ((long)local_790.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_790.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 + 1);
    local_790.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start[uVar3].nValue = 1000;
    pStack_490._union._8_8_ = (undefined1 *)0x0;
    pStack_490._union._16_8_ = (CTransaction *)0x0;
    local_498 = (undefined1  [8])0x0;
    pStack_490._union._0_8_ = (_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)0x0;
    local_748[0] = (class_property<bool>)0x51;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_498,(iterator)local_498,
               local_748);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&local_790.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start[uVar3].scriptPubKey.super_CScriptBase,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_498);
    if (0x1c < (uint)pStack_490._union._20_4_) {
      free((void *)local_498);
    }
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  if (local_790.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_790.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar3 = 0;
    do {
      local_498 = (undefined1  [8])((ulong)local_498 & 0xffffffffffff0000);
      local_3d0._M_color = _S_red;
      local_3d0._M_parent = (_Base_ptr)0x0;
      memset(&pStack_490,0,0xb8);
      local_3d0._M_left = &local_3d0;
      local_3b0 = 0;
      local_340 = false;
      local_330._M_color = _S_red;
      local_330._M_parent = (_Base_ptr)0x0;
      local_330._M_left = &local_330;
      local_310 = 0;
      local_300._M_color = _S_red;
      local_300._M_parent = (_Base_ptr)0x0;
      local_300._M_left = &local_300;
      local_2b8._M_color = _S_red;
      local_2b8._M_parent = (_Base_ptr)0x0;
      local_2e0 = 0;
      puStack_2d8 = (pointer)0x0;
      local_2d0 = (pointer)0x0;
      puStack_2c8 = (pointer)0x0;
      local_2b8._M_left = &local_2b8;
      local_298 = 0;
      local_288._M_color = _S_red;
      local_288._M_parent = (_Base_ptr)0x0;
      local_288._M_left = &local_288;
      local_268 = 0;
      local_258._M_color = _S_red;
      local_258._M_parent = (_Base_ptr)0x0;
      local_258._M_left = &local_258;
      local_1c0._M_color = _S_red;
      local_1c0._M_parent = (_Base_ptr)0x0;
      local_238 = 0;
      pCStack_230 = (pointer)0x0;
      local_228 = (pointer)0x0;
      pCStack_220 = (pointer)0x0;
      local_218 = (pointer)0x0;
      pCStack_210 = (pointer)0x0;
      local_208 = (pointer)0x0;
      auStack_200[0] = '\0';
      auStack_200[1] = '\0';
      auStack_200[2] = '\0';
      auStack_200[3] = '\0';
      auStack_200[4] = '\0';
      auStack_200[5] = '\0';
      auStack_200[6] = '\0';
      auStack_200[7] = '\0';
      auStack_200[8] = '\0';
      auStack_200[9] = '\0';
      auStack_200[10] = '\0';
      auStack_200[0xb] = '\0';
      auStack_200[0xc] = '\0';
      auStack_200[0xd] = '\0';
      auStack_200[0xe] = '\0';
      auStack_200[0xf] = '\0';
      auStack_200[0x10] = '\0';
      auStack_200[0x11] = '\0';
      auStack_200[0x12] = '\0';
      auStack_200[0x13] = '\0';
      auStack_200[0x14] = '\0';
      auStack_200[0x15] = '\0';
      auStack_200[0x16] = '\0';
      auStack_200[0x17] = '\0';
      auStack_200[0x18] = '\0';
      auStack_200[0x19] = '\0';
      auStack_200[0x1a] = '\0';
      auStack_200[0x1b] = '\0';
      auStack_200[0x1c] = '\0';
      auStack_200[0x1d] = '\0';
      auStack_200[0x1e] = '\0';
      auStack_200[0x1f] = '\0';
      auStack_200[0x20] = '\0';
      auStack_200[0x21] = '\0';
      auStack_200[0x22] = '\0';
      auStack_200[0x23] = '\0';
      auStack_200[0x24] = '\0';
      auStack_200[0x25] = '\0';
      auStack_200[0x26] = '\0';
      auStack_200[0x27] = '\0';
      auStack_200[0x28] = '\0';
      auStack_200[0x29] = '\0';
      auStack_200[0x2a] = '\0';
      auStack_200[0x2b] = '\0';
      auStack_200[0x2c] = '\0';
      auStack_200[0x2d] = '\0';
      auStack_200[0x2e] = '\0';
      auStack_200[0x2f] = '\0';
      auStack_200[0x30] = '\0';
      auStack_200[0x31] = '\0';
      auStack_200[0x32] = '\0';
      auStack_200[0x33] = '\0';
      local_1c0._M_left = &local_1c0;
      local_1a0 = 0;
      local_190._M_color = _S_red;
      local_190._M_parent = (_Base_ptr)0x0;
      local_190._M_left = &local_190;
      local_170 = 0;
      local_160._M_color = _S_red;
      local_160._M_parent = (_Base_ptr)0x0;
      local_160._M_left = &local_160;
      local_140 = 0;
      local_130._M_color = _S_red;
      local_130._M_parent = (_Base_ptr)0x0;
      local_110 = 0;
      local_648._0_8_ = (TransactionSerParams *)0x3e8;
      local_3d0._M_right = local_3d0._M_left;
      local_330._M_right = local_330._M_left;
      local_300._M_right = local_300._M_left;
      local_2b8._M_right = local_2b8._M_left;
      local_288._M_right = local_288._M_left;
      local_258._M_right = local_258._M_left;
      local_1c0._M_right = local_1c0._M_left;
      local_190._M_right = local_190._M_left;
      local_160._M_right = local_160._M_left;
      local_130._M_left = &local_130;
      local_130._M_right = &local_130;
      bVar2 = SignSignature(&local_c8.super_SigningProvider,(CScript *)&local_100.indirect_contents,
                            &local_790,(uint)uVar3,(CAmount *)local_648,
                            local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start
                            [uVar3 % (ulong)((long)local_7e8.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_7e8.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start >> 2)],
                            (SignatureData *)local_498);
      if (!bVar2) {
        __assert_fail("hashSigned",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                      ,0x231,"void transaction_tests::test_big_witness_transaction::test_method()");
      }
      SignatureData::~SignatureData((SignatureData *)local_498);
      uVar3 = (ulong)((uint)uVar3 + 1);
      uVar6 = ((long)local_790.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_790.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
    } while (uVar3 <= uVar6 && uVar6 - uVar3 != 0);
  }
  pStack_490._union.indirect_contents.indirect = (char *)&local_808;
  local_808._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_7f0 = 0;
  local_808._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_808._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_498 = (undefined1  [8])&::TX_WITH_WITNESS;
  SerializeTransaction<ParamsStream<DataStream&,TransactionSerParams>,CMutableTransaction>
            (&local_790,(ParamsStream<DataStream_&,_TransactionSerParams> *)local_498,
             &::TX_WITH_WITNESS);
  CTransaction::CTransaction<DataStream>(&local_518,&::TX_WITH_WITNESS,&local_808);
  PrecomputedTransactionData::PrecomputedTransactionData<CTransaction>
            ((PrecomputedTransactionData *)local_648,&local_518);
  CCheckQueue<CScriptCheck>::CCheckQueue((CCheckQueue<CScriptCheck> *)local_748,0x80,0x14);
  local_758.fDone = false;
  local_758.pqueue = (CCheckQueue<CScriptCheck> *)local_748;
  iVar4 = pthread_mutex_lock(&local_670);
  if (iVar4 == 0) {
    local_828.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_828.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_828.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (local_790.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_790.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar3 = 1;
      do {
        CTxOut::CTxOut((CTxOut *)local_498);
        local_470[0]._0_1_ = '\x02';
        local_470[0]._1_1_ = '\0';
        local_470[0]._2_1_ = '\0';
        local_470[0]._3_1_ = '\0';
        local_498 = (undefined1  [8])0x3e8;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&pStack_490,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_100.indirect_contents)
        ;
        std::vector<Coin,_std::allocator<Coin>_>::emplace_back<Coin>(&local_828,(Coin *)local_498);
        if (0x1c < pStack_490._size) {
          free((void *)pStack_490._union._0_8_);
        }
        uVar6 = ((long)local_790.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_790.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
        bVar2 = uVar3 <= uVar6;
        lVar5 = uVar6 - uVar3;
        uVar3 = (ulong)((int)uVar3 + 1);
      } while (bVar2 && lVar5 != 0);
    }
    SignatureCache::SignatureCache((SignatureCache *)local_498,0x1000000);
    local_82c = 0;
    if (local_790.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_790.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar3 = 0;
      do {
        local_848 = 0;
        uStack_840 = 0;
        local_838 = 0;
        local_84c = 0x801;
        local_84d = false;
        local_858 = (PrecomputedTransactionData *)local_648;
        std::vector<CScriptCheck,std::allocator<CScriptCheck>>::
        emplace_back<CTxOut&,CTransaction&,SignatureCache&,unsigned_int&,unsigned_int,bool,PrecomputedTransactionData*>
                  ((vector<CScriptCheck,std::allocator<CScriptCheck>> *)&local_848,
                   &local_828.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [local_518.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar3].prevout.n].out,&local_518,
                   (SignatureCache *)local_498,&local_82c,&local_84c,&local_84d,&local_858);
        if (local_758.pqueue != (CCheckQueue<CScriptCheck> *)0x0) {
          CCheckQueue<CScriptCheck>::Add
                    (local_758.pqueue,
                     (vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                     &local_848);
        }
        std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::~vector
                  ((vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)&local_848);
        local_82c = local_82c + 1;
        uVar3 = (ulong)local_82c;
        uVar6 = ((long)local_790.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_790.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
      } while (uVar3 <= uVar6 && uVar6 - uVar3 != 0);
    }
    if (local_758.pqueue != (CCheckQueue<CScriptCheck> *)0x0) {
      bVar2 = CCheckQueue<CScriptCheck>::Loop(local_758.pqueue,true);
      local_758.fDone = true;
      if (!bVar2) goto LAB_0066c73d;
    }
    if (local_3a8._M_value.m_branch.
        super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3a8._M_value.m_branch.
                      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,local_3a8._40_8_ - local_3a8._8_8_);
      local_3a8._M_value.m_branch.
      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3a8._16_4_ = 0;
      local_3a8._M_value.m_branch.
      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3a8._32_4_ = 0;
      local_3a8._40_8_ = 0;
    }
    if ((void *)local_3a8._0_8_ != (void *)0x0) {
      operator_delete__((void *)local_3a8._0_8_);
    }
    local_3a8._0_8_ = (void *)0x0;
    if (local_3d0._M_parent != (_Base_ptr)0x0) {
      operator_delete(local_3d0._M_parent,(long)local_3d0._M_right - (long)local_3d0._M_parent);
    }
    std::vector<Coin,_std::allocator<Coin>_>::~vector(&local_828);
    CCheckQueueControl<CScriptCheck>::~CCheckQueueControl(&local_758);
    CCheckQueue<CScriptCheck>::~CCheckQueue((CCheckQueue<CScriptCheck> *)local_748);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_540);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_518.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_518.vin);
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_808);
    if (local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_7e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (0x1c < local_e4) {
      free(local_100.indirect_contents.indirect);
    }
    local_c8.super_SigningProvider._vptr_SigningProvider =
         (_func_int **)&PTR__FillableSigningProvider_01399e20;
    std::
    _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
    ::~_Rb_tree(&local_c8.mapScripts._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::~_Rb_tree(&local_c8.mapKeys._M_t);
    if ((_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)local_798._M_head_impl !=
        (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_798,
                 local_798._M_head_impl);
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_790.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_790.vin);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    std::__throw_system_error(iVar4);
LAB_0066c73d:
    __assert_fail("controlCheck",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                  ,0x250,"void transaction_tests::test_big_witness_transaction::test_method()");
  }
LAB_0066c9e6:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_big_witness_transaction)
{
    CMutableTransaction mtx;
    mtx.version = 1;

    CKey key = GenerateRandomKey(); // Need to use compressed keys in segwit or the signing will fail
    FillableSigningProvider keystore;
    BOOST_CHECK(keystore.AddKeyPubKey(key, key.GetPubKey()));
    CKeyID hash = key.GetPubKey().GetID();
    CScript scriptPubKey = CScript() << OP_0 << std::vector<unsigned char>(hash.begin(), hash.end());

    std::vector<int> sigHashes;
    sigHashes.push_back(SIGHASH_NONE | SIGHASH_ANYONECANPAY);
    sigHashes.push_back(SIGHASH_SINGLE | SIGHASH_ANYONECANPAY);
    sigHashes.push_back(SIGHASH_ALL | SIGHASH_ANYONECANPAY);
    sigHashes.push_back(SIGHASH_NONE);
    sigHashes.push_back(SIGHASH_SINGLE);
    sigHashes.push_back(SIGHASH_ALL);

    // create a big transaction of 4500 inputs signed by the same key
    for(uint32_t ij = 0; ij < 4500; ij++) {
        uint32_t i = mtx.vin.size();
        COutPoint outpoint(Txid::FromHex("0000000000000000000000000000000000000000000000000000000000000100").value(), i);

        mtx.vin.resize(mtx.vin.size() + 1);
        mtx.vin[i].prevout = outpoint;
        mtx.vin[i].scriptSig = CScript();

        mtx.vout.resize(mtx.vout.size() + 1);
        mtx.vout[i].nValue = 1000;
        mtx.vout[i].scriptPubKey = CScript() << OP_1;
    }

    // sign all inputs
    for(uint32_t i = 0; i < mtx.vin.size(); i++) {
        SignatureData empty;
        bool hashSigned = SignSignature(keystore, scriptPubKey, mtx, i, 1000, sigHashes.at(i % sigHashes.size()), empty);
        assert(hashSigned);
    }

    DataStream ssout;
    ssout << TX_WITH_WITNESS(mtx);
    CTransaction tx(deserialize, TX_WITH_WITNESS, ssout);

    // check all inputs concurrently, with the cache
    PrecomputedTransactionData txdata(tx);
    CCheckQueue<CScriptCheck> scriptcheckqueue(/*batch_size=*/128, /*worker_threads_num=*/20);
    CCheckQueueControl<CScriptCheck> control(&scriptcheckqueue);

    std::vector<Coin> coins;
    for(uint32_t i = 0; i < mtx.vin.size(); i++) {
        Coin coin;
        coin.nHeight = 1;
        coin.fCoinBase = false;
        coin.out.nValue = 1000;
        coin.out.scriptPubKey = scriptPubKey;
        coins.emplace_back(std::move(coin));
    }

    SignatureCache signature_cache{DEFAULT_SIGNATURE_CACHE_BYTES};

    for(uint32_t i = 0; i < mtx.vin.size(); i++) {
        std::vector<CScriptCheck> vChecks;
        vChecks.emplace_back(coins[tx.vin[i].prevout.n].out, tx, signature_cache, i, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, false, &txdata);
        control.Add(std::move(vChecks));
    }

    bool controlCheck = control.Wait();
    assert(controlCheck);
}